

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void env_put(char *identifer,int line,Object value,Environment *env)

{
  ObjectType OVar1;
  int iVar2;
  Instance *__ptr;
  Record *pRVar3;
  Record **ppRVar4;
  
  pRVar3 = env_match(identifer,env);
  if (pRVar3 == (Record *)0x0) {
    pRVar3 = (Record *)malloc(0x50);
    pRVar3->name = identifer;
    if (value.type == OBJECT_INSTANCE) {
      if ((value.field_1.instance)->fromReturn == 1) {
        (value.field_1.instance)->fromReturn = 0;
      }
      (value.field_1.instance)->refCount = (value.field_1.instance)->refCount + 1;
    }
    *(long *)&pRVar3->object = value._0_8_;
    (pRVar3->object).field_1.instance = value.field_1.instance;
    (pRVar3->object).field_1.literal.field_2 = value.field_1.literal.field_2;
    *(undefined8 *)((long)&(pRVar3->object).field_1 + 0x10) = value.field_1._16_8_;
    (pRVar3->object).field_1.routine.arguments = value.field_1.routine.arguments;
    *(undefined8 *)((long)&(pRVar3->object).field_1 + 0x20) = value.field_1._32_8_;
    *(Statement **)((long)&(pRVar3->object).field_1 + 0x28) =
         value.field_1.container.constructor.statements;
    *(Statement **)((long)&(pRVar3->object).field_1 + 0x30) = value.field_1.routine.code.statements;
    pRVar3->next = (Record *)0x0;
    ppRVar4 = &env->rear;
    if (env->front != (Record *)0x0) {
      env = (Environment *)ppRVar4;
      ppRVar4 = &(*ppRVar4)->next;
    }
    *ppRVar4 = pRVar3;
    env->front = pRVar3;
  }
  else {
    OVar1 = (pRVar3->object).type;
    if (OVar1 == OBJECT_ARRAY) {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Array cannot be assigned directly!\x1b[0m",line);
      stop();
      return;
    }
    __ptr = (pRVar3->object).field_1.instance;
    if (value.type == OBJECT_INSTANCE) {
      if ((value.field_1.instance)->fromReturn == 1) {
        (value.field_1.instance)->fromReturn = 0;
      }
      (value.field_1.instance)->refCount = (value.field_1.instance)->refCount + 1;
    }
    *(Statement **)((long)&(pRVar3->object).field_1 + 0x28) =
         value.field_1.container.constructor.statements;
    *(Statement **)((long)&(pRVar3->object).field_1 + 0x30) = value.field_1.routine.code.statements;
    (pRVar3->object).field_1.routine.arguments = value.field_1.routine.arguments;
    *(undefined8 *)((long)&(pRVar3->object).field_1 + 0x20) = value.field_1._32_8_;
    (pRVar3->object).field_1.literal.field_2 = value.field_1.literal.field_2;
    *(undefined8 *)((long)&(pRVar3->object).field_1 + 0x10) = value.field_1._16_8_;
    *(long *)&pRVar3->object = value._0_8_;
    (pRVar3->object).field_1.instance = value.field_1.instance;
    if (((OVar1 == OBJECT_INSTANCE) &&
        (iVar2 = __ptr->refCount, __ptr->refCount = iVar2 + -1, iVar2 < 2)) &&
       (__ptr->fromReturn == 0)) {
      env_free((Environment *)__ptr->environment);
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void env_put(char* identifer, int line, Object value, Environment *env){
    Record *get = env_match(identifer, env);
    if(get == NULL)
        rec_new(identifer, value, env);
    else if(get->object.type == OBJECT_ARRAY){
        printf(runtime_error("Array cannot be assigned directly!"), line);
        stop();
    }
    else{
        Object old = get->object;
        incr_ref(value);
        get->object = value;
        if(old.type == OBJECT_INSTANCE){
            gc_obj(old);
            //            printf(debug("[Put] Reassigning %s! Decremented refcount of %s#%d to %d!"),
            //                    identifer, get->object.instance->name, get->object.instance->insCount,
            //                    get->object.instance->refCount);
        }
    }
}